

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O3

void __thiscall qpdf::Array::push_back(Array *this,QPDFObjectHandle *item)

{
  element_type *peVar1;
  element_type *peVar2;
  QPDF *pQVar3;
  QPDF *pQVar4;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var5;
  QPDF_Array *pQVar6;
  mapped_type *pmVar7;
  logic_error *this_00;
  key_type local_14;
  
  pQVar6 = array(this);
  peVar1 = (item->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Attempting to add an uninitialized object to a QPDF_Array.");
LAB_001fda37:
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar2 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar2 != (element_type *)0x0) && (pQVar3 = peVar2->qpdf, pQVar3 != (QPDF *)0x0)) {
    pQVar4 = peVar1->qpdf;
    if (pQVar3 != pQVar4 && pQVar4 != (QPDF *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "Attempting to add an object from a different QPDF. Use QPDF::copyForeignObject to add objects from another file."
                );
      goto LAB_001fda37;
    }
  }
  _Var5._M_head_impl =
       (pQVar6->sp)._M_t.
       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
       super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (Sparse *)0x0) {
    (_Var5._M_head_impl)->size = (_Var5._M_head_impl)->size + 1;
    pmVar7 = std::
             map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
             ::operator[](&(_Var5._M_head_impl)->elements,&local_14);
    (pmVar7->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (item->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar7->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(item->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
  emplace_back<QPDFObjectHandle_const&>
            ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&pQVar6->elements,item);
  return;
}

Assistant:

void
Array::push_back(QPDFObjectHandle const& item)
{
    auto a = array();
    checkOwnership(item);
    if (a->sp) {
        a->sp->elements[(a->sp->size)++] = item;
    } else {
        a->elements.emplace_back(item);
    }
}